

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint32_t Catch::anon_unknown_1::headerValue(uchar c)

{
  ReusableStringStream *pRVar1;
  byte in_DIL;
  SourceLineInfo *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa0;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  uint local_4;
  
  if ((in_DIL & 0xe0) == 0xc0) {
    local_4 = in_DIL & 0x1f;
  }
  else if ((in_DIL & 0xf0) == 0xe0) {
    local_4 = in_DIL & 0xf;
  }
  else {
    if ((in_DIL & 0xf8) != 0xf0) {
      ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&stack0xffffffffffffffb0,
                 "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                 ,0x3c6d);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      pRVar1 = ReusableStringStream::operator<<
                         (in_stack_ffffffffffffff80,(char (*) [26])in_stack_ffffffffffffff78);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [47])in_stack_ffffffffffffff78);
      ReusableStringStream::str_abi_cxx11_(pRVar1);
      throw_logic_error(in_stack_ffffffffffffffa0);
    }
    local_4 = in_DIL & 7;
  }
  return local_4;
}

Assistant:

uint32_t headerValue(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return c & 0x1F;
        }
        if ((c & 0xF0) == 0xE0) {
            return c & 0x0F;
        }
        if ((c & 0xF8) == 0xF0) {
            return c & 0x07;
        }
        CATCH_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }